

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<wchar_t>,fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,char_writer *f)

{
  checked_ptr<typename_buffer<wchar_t>::value_type> pwVar1;
  wchar_t *pwVar2;
  byte bVar3;
  ulong uVar4;
  char_type fill;
  
  uVar4 = (ulong)(uint)specs->width;
  if (uVar4 < 2) {
    pwVar2 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,1);
LAB_00189b84:
    *pwVar2 = f->value;
  }
  else {
    pwVar1 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,uVar4);
    uVar4 = uVar4 - 1;
    bVar3 = specs->field_0x9 & 0xf;
    if (bVar3 == 3) {
      pwVar1 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1,uVar4 >> 1,&fill);
      *pwVar1 = f->value;
      uVar4 = uVar4 - (uVar4 >> 1);
    }
    else {
      if (bVar3 == 2) {
        pwVar2 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1,uVar4,&fill);
        goto LAB_00189b84;
      }
      *pwVar1 = f->value;
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(pwVar1 + 1,uVar4,&fill);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }